

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  int iVar1;
  int extraout_var;
  int extraout_var_00;
  long unaff_RBP;
  __node_base *p_Var3;
  long lVar4;
  string s;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  Stream *local_38;
  long lVar2;
  
  p_Var3 = &(headers->_M_h)._M_before_begin;
  lVar4 = 0;
  local_38 = strm;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    local_58 = &local_48;
    local_50 = 0;
    local_48 = 0;
    ::std::__cxx11::string::_M_assign((string *)&local_58);
    ::std::__cxx11::string::append((char *)&local_58);
    ::std::__cxx11::string::_M_append((char *)&local_58,(ulong)p_Var3[5]._M_nxt);
    ::std::__cxx11::string::append((char *)&local_58);
    iVar1 = (*local_38->_vptr_Stream[6])(local_38,local_58,local_50);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (extraout_var < 0) {
      unaff_RBP = lVar2;
      lVar2 = 0;
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    lVar4 = lVar4 + lVar2;
  } while (-1 < extraout_var);
  if (p_Var3 == (__node_base *)0x0) {
    iVar1 = (*local_38->_vptr_Stream[6])(local_38,"\r\n",2);
    if (extraout_var_00 < 0) {
      lVar4 = 0;
    }
    unaff_RBP = lVar4 + CONCAT44(extraout_var_00,iVar1);
  }
  return unaff_RBP;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    std::string s;
    s = x.first;
    s += ": ";
    s += x.second;
    s += "\r\n";

    auto len = strm.write(s.data(), s.size());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}